

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

char units::getMatchCharacter(char mchar)

{
  int iVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,mchar);
  iVar1 = iVar2;
  if (iVar2 < 0x5b) {
    if (iVar2 < 0x3c) {
      if (iVar2 == 0x28) {
        return ')';
      }
      if (iVar2 == 0x29) {
        return '(';
      }
    }
    else {
      if (iVar2 == 0x3c) {
        return '>';
      }
      if (iVar2 == 0x3e) {
        return '<';
      }
    }
  }
  else if (iVar2 < 0x7b) {
    if (iVar2 == 0x5b) {
      return ']';
    }
    if (iVar2 == 0x5d) {
      return '[';
    }
  }
  else {
    iVar1 = 0x7d;
    if ((iVar2 != 0x7b) && (iVar1 = iVar2, iVar2 == 0x7d)) {
      return '{';
    }
  }
  return (char)iVar1;
}

Assistant:

static char getMatchCharacter(char mchar)
{
    switch (mchar) {
        case '{':
            return '}';
        case '[':
            return ']';
        case '(':
            return ')';
        case '<':
            return '>';
        case '}':
            return '{';
        case ']':
            return '[';
        case ')':
            return '(';
        case '>':
            return '<';
        case '\'':
        case '"':
        case '`':
        default:
            return mchar;
    }
}